

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O2

ON_PointCloud *
ON_PointCloud::RandomSubsample
          (ON_PointCloud *source_point_cloud,uint subsample_point_count,
          ON_PointCloud *destination_point_cloud,ON_ProgressReporter *progress_reporter,
          ON_Terminator *terminator)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  bool *pbVar7;
  bool bVar8;
  ON__UINT32 OVar9;
  ON_PointCloud *this;
  uint uVar10;
  ulong uVar11;
  uint i;
  uint uVar12;
  uint j;
  ON_RandomNumberGenerator gen;
  ON_RandomNumberGenerator local_9f4;
  
  if (subsample_point_count != 0 && source_point_cloud != (ON_PointCloud *)0x0) {
    uVar2 = (source_point_cloud->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (subsample_point_count <= uVar2 && uVar2 - subsample_point_count != 0) {
      uVar10 = (source_point_cloud->m_N).m_count;
      uVar3 = (source_point_cloud->m_C).m_count;
      uVar4 = (source_point_cloud->m_V).m_count;
      uVar5 = (source_point_cloud->m_H).m_count;
      if (destination_point_cloud == (ON_PointCloud *)0x0) {
        this = (ON_PointCloud *)operator_new(0x148);
        ON_PointCloud(this,source_point_cloud);
      }
      else {
        this = destination_point_cloud;
        if (source_point_cloud != destination_point_cloud) {
          Destroy(destination_point_cloud);
          operator=(destination_point_cloud,source_point_cloud);
        }
      }
      ON_RandomNumberGenerator::ON_RandomNumberGenerator(&local_9f4);
      ON_RandomNumberGenerator::Seed(&local_9f4);
      uVar12 = 0;
      j = uVar2;
      do {
        if (subsample_point_count == j) break;
        if ((terminator != (ON_Terminator *)0x0) &&
           (bVar8 = ON_Terminator::TerminationRequested(terminator), bVar8)) {
          if (this != source_point_cloud) {
            Destroy(this);
          }
          if (destination_point_cloud != (ON_PointCloud *)0x0) {
            return (ON_PointCloud *)0x0;
          }
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this);
          return (ON_PointCloud *)0x0;
        }
        if (progress_reporter != (ON_ProgressReporter *)0x0) {
          ON_ProgressReporter::ReportProgress
                    (progress_reporter,(double)uVar12 / (double)(uVar2 - subsample_point_count));
        }
        OVar9 = ON_RandomNumberGenerator::RandomNumber(&local_9f4);
        i = OVar9 % j;
        j = j - 1;
        ON_SimpleArray<ON_3dPoint>::Swap(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,i,j);
        if (uVar2 == uVar10) {
          ON_SimpleArray<ON_3dVector>::Swap(&this->m_N,i,j);
        }
        if (uVar2 == uVar3) {
          ON_SimpleArray<ON_Color>::Swap(&this->m_C,i,j);
        }
        if (j != i && uVar2 == uVar4) {
          pdVar6 = (this->m_V).m_a;
          dVar1 = pdVar6[(int)i];
          pdVar6[(int)i] = pdVar6[(int)j];
          pdVar6[(int)j] = dVar1;
        }
        if (uVar2 == uVar5 && j != i) {
          pbVar7 = (this->m_H).m_a;
          bVar8 = pbVar7[(int)i];
          pbVar7[(int)i] = pbVar7[(int)j];
          pbVar7[(int)j] = bVar8;
        }
        uVar12 = uVar12 + 1;
      } while (j != 0);
      if (progress_reporter != (ON_ProgressReporter *)0x0) {
        ON_ProgressReporter::ReportProgress(progress_reporter,1.0);
      }
      if ((-1 < (int)subsample_point_count) &&
         ((int)subsample_point_count <= (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
        (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count = subsample_point_count;
      }
      ON_SimpleArray<ON_3dPoint>::Shrink(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
      if (uVar2 == uVar10) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_N).m_capacity)) {
          (this->m_N).m_count = subsample_point_count;
        }
        ON_SimpleArray<ON_3dVector>::Shrink(&this->m_N);
      }
      if (uVar2 == uVar3) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_C).m_capacity)) {
          (this->m_C).m_count = subsample_point_count;
        }
        ON_SimpleArray<ON_Color>::Shrink(&this->m_C);
      }
      if (uVar2 == uVar4) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_V).m_capacity)) {
          (this->m_V).m_count = subsample_point_count;
        }
        ON_SimpleArray<double>::Shrink(&this->m_V);
      }
      if (uVar2 == uVar5) {
        if ((-1 < (int)subsample_point_count) &&
           ((int)subsample_point_count <= (this->m_H).m_capacity)) {
          (this->m_H).m_count = subsample_point_count;
        }
        ON_SimpleArray<bool>::Shrink(&this->m_H);
        this->m_hidden_count = 0;
        uVar2 = (this->m_H).m_count;
        uVar10 = 0;
        for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
          if ((this->m_H).m_a[uVar11] == true) {
            uVar10 = uVar10 + 1;
            this->m_hidden_count = uVar10;
          }
        }
        return this;
      }
      return this;
    }
  }
  return (ON_PointCloud *)0x0;
}

Assistant:

ON_PointCloud* ON_PointCloud::RandomSubsample(
  const ON_PointCloud* source_point_cloud,
  const unsigned int subsample_point_count,
  ON_PointCloud* destination_point_cloud,
  ON_ProgressReporter* progress_reporter,
  ON_Terminator* terminator
)
{
  if (
       nullptr == source_point_cloud 
    || subsample_point_count <= 0 
    || subsample_point_count >= source_point_cloud->m_P.UnsignedCount()
    )
    return nullptr;

  const unsigned int point_count = source_point_cloud->m_P.UnsignedCount();
  const unsigned int points_to_remove = point_count - subsample_point_count;
  if (points_to_remove <= 0)
    return nullptr;

  const bool bHaveNormals = point_count == source_point_cloud->m_N.UnsignedCount();
  const bool bHaveColors = point_count == source_point_cloud->m_C.UnsignedCount();
  const bool bHaveValues = point_count == source_point_cloud->m_V.UnsignedCount();
  const bool bHaveHidden = point_count == source_point_cloud->m_H.UnsignedCount();

  bool bAlloc = false;
  if (destination_point_cloud)
  {
    if (source_point_cloud != destination_point_cloud)
    {
      destination_point_cloud->Destroy();
      *destination_point_cloud = *source_point_cloud;
    }
  }
  else
  {
    destination_point_cloud = new ON_PointCloud(*source_point_cloud);
    bAlloc = true;
  }

  ON_RandomNumberGenerator gen;
  gen.Seed();

  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < points_to_remove; i++)
  {
    if (terminator && ON_Terminator::TerminationRequested(terminator))
    {
      if (source_point_cloud != destination_point_cloud)
        destination_point_cloud->Destroy();
      if (bAlloc)
        delete destination_point_cloud;
      return nullptr;
    }

    if (progress_reporter)
      ON_ProgressReporter::ReportProgress(progress_reporter, i / (double)points_to_remove);

    // For (min <= r < max): min + RandomNumber() % (max-min)
    const int point_index = gen.RandomNumber() % last_point_count;

    destination_point_cloud->m_P.Swap(point_index, last_point_count - 1);
    if (bHaveNormals)
      destination_point_cloud->m_N.Swap(point_index, last_point_count - 1);
    if (bHaveColors)
      destination_point_cloud->m_C.Swap(point_index, last_point_count - 1);
    if (bHaveValues)
      destination_point_cloud->m_V.Swap(point_index, last_point_count - 1);
    if (bHaveHidden)
      destination_point_cloud->m_H.Swap(point_index, last_point_count - 1);

    last_point_count--;
    if (last_point_count <= 0)
      break;
  }

  if (progress_reporter)
    ON_ProgressReporter::ReportProgress(progress_reporter, 1.0);

  destination_point_cloud->m_P.SetCount(subsample_point_count);
  destination_point_cloud->m_P.Shrink();
  if (bHaveNormals)
  {
    destination_point_cloud->m_N.SetCount(subsample_point_count);
    destination_point_cloud->m_N.Shrink();
  }
  if (bHaveColors)
  {
    destination_point_cloud->m_C.SetCount(subsample_point_count);
    destination_point_cloud->m_C.Shrink();
  }
  if (bHaveValues)
  {
    destination_point_cloud->m_V.SetCount(subsample_point_count);
    destination_point_cloud->m_V.Shrink();
  }
  if (bHaveHidden)
  {
    destination_point_cloud->m_H.SetCount(subsample_point_count);
    destination_point_cloud->m_H.Shrink();
    destination_point_cloud->m_hidden_count = 0;
    for (unsigned int i = 0; i < destination_point_cloud->m_H.UnsignedCount(); i++)
    {
      if (destination_point_cloud->m_H[i])
        destination_point_cloud->m_hidden_count++;
    }
  }

  return destination_point_cloud;
}